

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O0

int Gem_GroupVarsInsert3(int Groups,int i)

{
  uint local_18;
  int Mask;
  int i_local;
  int Groups_local;
  
  if (i == -1) {
    local_18 = 0;
  }
  else {
    local_18 = Abc_InfoMask(i + 1);
  }
  if (-1 < i + 1) {
    if ((i != -1) && ((Groups >> ((byte)i & 0x1f) & 1U) == 0)) {
      __assert_fail("i == -1 || (Groups >> i) & 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMaj.c"
                    ,0xb1,"int Gem_GroupVarsInsert3(int, int)");
    }
    return Groups & local_18 | (Groups & (local_18 ^ 0xffffffff)) << 3 | 4 << ((byte)i + 1 & 0x1f);
  }
  __assert_fail("i+1 >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMaj.c"
                ,0xb0,"int Gem_GroupVarsInsert3(int, int)");
}

Assistant:

int Gem_GroupVarsInsert3( int Groups, int i ) // insert group of 3 bits after i
{
    int Mask = i+1 ? Abc_InfoMask( i+1 ) : 0;
    assert( i+1 >= 0 );
    assert( i == -1 || (Groups >> i) & 1 );
    return (Groups & Mask) | ((Groups & ~Mask) << 3) | (0x4 << (i+1));
}